

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetSP.c
# Opt level: O3

DdNode * cuddSubsetShortPaths(DdManager *dd,DdNode *f,int numVars,int threshold,int hardlimit)

{
  FILE *__s;
  int iVar1;
  int *piVar2;
  AssortedInfo *pathLengthArray;
  FILE *table;
  NodeDist_t **ppNVar3;
  NodeDist_t *value;
  DdNode ***pppDVar4;
  DdNode **__ptr;
  AssortedInfo *info;
  st__table *psVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int in_R9D;
  FILE *fp;
  long lVar11;
  NodeDist_t *nodeStat;
  int in_stack_ffffffffffffff88;
  int *local_38;
  
  one = dd->one;
  zero = (DdNode *)((ulong)one ^ 1);
  if (numVars == 0) {
    numVars = Cudd_ReadSize(dd);
  }
  iVar8 = 0;
  if (numVars < threshold) {
    iVar8 = numVars;
  }
  if (f == (DdNode *)0x0) {
    fwrite("Cannot partition, nil object\n",0x1d,1,(FILE *)dd->err);
    dd->errorCode = CUDD_INVALID_ARG;
    return (DdNode *)0x0;
  }
  piVar2 = (int *)((ulong)f & 0xfffffffffffffffe);
  if (*piVar2 == 0x7fffffff) {
    return f;
  }
  uVar10 = numVars + 1;
  pathLengthArray = (AssortedInfo *)malloc((long)(int)uVar10 << 2);
  if (-1 < numVars) {
    memset(pathLengthArray,0,(ulong)uVar10 << 2);
  }
  __s = (FILE *)dd->err;
  table = (FILE *)st__init_table(st__ptrcmp,st__ptrhash);
  maxNodeDistPages = 0x80;
  ppNVar3 = (NodeDist_t **)malloc(0x400);
  nodeDistPages = ppNVar3;
  if (ppNVar3 == (NodeDist_t **)0x0) {
LAB_007eafa2:
    fwrite("Out of Memory, cannot allocate pages\n",0x25,1,__s);
    memOut = 1;
  }
  else {
    nodeDistPage = 0;
    value = (NodeDist_t *)malloc(0x10000);
    *ppNVar3 = value;
    currentNodeDistPage = value;
    if (value == (NodeDist_t *)0x0) {
      free(ppNVar3);
      nodeDistPages = (NodeDist_t **)0x0;
      goto LAB_007eafa2;
    }
    nodeDistPageIndex = 0;
    maxQueuePages = 0x80;
    pppDVar4 = (DdNode ***)malloc(0x400);
    queuePages = pppDVar4;
    if (pppDVar4 == (DdNode ***)0x0) goto LAB_007eafa2;
    queuePage = 0;
    __ptr = (DdNode **)malloc(0x4000);
    *pppDVar4 = __ptr;
    currentQueuePage = __ptr;
    if (__ptr == (DdNode **)0x0) {
      free(pppDVar4);
      queuePages = (DdNode ***)0x0;
      goto LAB_007eafa2;
    }
    *__ptr = f;
    queuePageIndex = 1;
    if (memOut == 1) {
      free(value);
      free(ppNVar3);
      nodeDistPages = (NodeDist_t **)0x0;
      free(__ptr);
      free(pppDVar4);
      queuePages = (DdNode ***)0x0;
      st__free_table((st__table *)table);
      goto LAB_007eafa2;
    }
    nodeDistPageIndex = 1;
    value->oddTopDist = 0xffffffff;
    value->evenTopDist = 0xffffffff;
    value->oddBotDist = 0xffffffff;
    value->evenBotDist = 0xffffffff;
    value->regResult = (DdNode *)0x0;
    value->compResult = (DdNode *)0x0;
    fp = table;
    iVar1 = st__insert((st__table *)table,(char *)piVar2,(char *)value);
    ppNVar3 = nodeDistPages;
    if (iVar1 == 1) {
      fwrite("Something wrong, the entry exists but didnt show up in st__lookup\n",0x42,1,__s);
    }
    else {
      if (iVar1 == -10000) {
        memOut = 1;
        uVar6 = (ulong)(uint)nodeDistPage;
        if (nodeDistPage < 0) {
          if (nodeDistPages != (NodeDist_t **)0x0) goto LAB_007eb145;
        }
        else {
          lVar11 = 0;
          do {
            if (ppNVar3[lVar11] != (NodeDist_t *)0x0) {
              free(ppNVar3[lVar11]);
              ppNVar3[lVar11] = (NodeDist_t *)0x0;
            }
            lVar11 = lVar11 + 1;
          } while (uVar6 + 1 != lVar11);
LAB_007eb145:
          free(ppNVar3);
          nodeDistPages = (NodeDist_t **)0x0;
        }
        pppDVar4 = queuePages;
        uVar6 = (ulong)(uint)queuePage;
        if (queuePage < 0) {
          if (queuePages != (DdNode ***)0x0) goto LAB_007eb196;
        }
        else {
          lVar11 = 0;
          do {
            if (pppDVar4[lVar11] != (DdNode **)0x0) {
              free(pppDVar4[lVar11]);
              pppDVar4[lVar11] = (DdNode **)0x0;
            }
            lVar11 = lVar11 + 1;
          } while (uVar6 + 1 != lVar11);
LAB_007eb196:
          free(pppDVar4);
          queuePages = (DdNode ***)0x0;
        }
        st__free_table((st__table *)table);
        goto LAB_007eafa2;
      }
      if (((ulong)f & 1) == 0) {
        value->evenTopDist = 0;
      }
      else {
        value->oddTopDist = 0;
      }
      CreateTopDist((st__table *)table,0,0,0,(DdNode **)0x1,in_R9D,in_stack_ffffffffffffff88,fp);
      if (memOut == 1) {
        fwrite("Out of Memory and cant count path lengths\n",0x2a,1,__s);
        goto LAB_007eafa2;
      }
      iVar1 = CreateBotDist(f,(st__table *)table,(uint *)pathLengthArray,(FILE *)__s);
      pppDVar4 = queuePages;
      if (iVar1 == 0) goto LAB_007eafc7;
      uVar6 = (ulong)(uint)queuePage;
      if (queuePage < 0) {
        if (queuePages != (DdNode ***)0x0) goto LAB_007eb1bb;
      }
      else {
        lVar11 = 0;
        do {
          if (pppDVar4[lVar11] != (DdNode **)0x0) {
            free(pppDVar4[lVar11]);
            pppDVar4[lVar11] = (DdNode **)0x0;
          }
          lVar11 = lVar11 + 1;
        } while (uVar6 + 1 != lVar11);
LAB_007eb1bb:
        free(pppDVar4);
        queuePages = (DdNode ***)0x0;
      }
      if ((fp != (FILE *)0x0) && ((memOut & 1) == 0)) {
        iVar8 = threshold - iVar8;
        uVar7 = 0;
        iVar1 = iVar8;
        if (0 < iVar8 && uVar10 != 0) {
          uVar6 = 0;
          uVar7 = 0;
          do {
            iVar1 = iVar1 - (&pathLengthArray->maxpath)[uVar6];
            uVar9 = (uint)uVar6;
            if ((&pathLengthArray->maxpath)[uVar6] == 0) {
              uVar9 = uVar7;
            }
            uVar7 = uVar9;
            uVar6 = uVar6 + 1;
          } while ((uVar6 < uVar10) && (0 < iVar1));
        }
        if (iVar1 < 0) {
          iVar1 = iVar1 + (&pathLengthArray->maxpath)[uVar7];
        }
        else {
          uVar7 = uVar7 + 1;
          iVar1 = 0;
        }
        if (uVar7 == 0) {
          fwrite("Path Length array seems to be all zeroes, check\n",0x30,1,(FILE *)dd->err);
        }
        if (uVar7 == uVar10) {
          piVar2[1] = piVar2[1] + 1;
        }
        else {
          info = (AssortedInfo *)malloc(0x20);
          info->maxpath = uVar7;
          info->findShortestPath = 0;
          info->thresholdReached = iVar1;
          psVar5 = st__init_table(st__ptrcmp,st__ptrhash);
          info->maxpathTable = psVar5;
          info->threshold = iVar8;
          iVar8 = st__lookup((st__table *)fp,(char *)piVar2,(char **)&local_38);
          if (iVar8 == 0) {
            fwrite("Something wrong, root node must be in table\n",0x2c,1,(FILE *)dd->err);
            dd->errorCode = CUDD_INTERNAL_ERROR;
            pathLengthArray = info;
            goto LAB_007eafcf;
          }
          uVar10 = 0xffffffff;
          uVar9 = 0xffffffff;
          if ((*local_38 != -1) && (uVar9 = *local_38 + local_38[2], local_38[2] == -1)) {
            uVar9 = 0xffffffff;
          }
          if ((local_38[1] != -1) && (uVar10 = local_38[1] + local_38[3], local_38[3] == -1)) {
            uVar10 = 0xffffffff;
          }
          if (uVar9 < uVar10) {
            uVar10 = uVar9;
          }
          if (uVar7 < uVar10) {
            fprintf((FILE *)dd->err,
                    "All computations are bogus, since root has path length greater than max path length within threshold %u, %u\n"
                    ,(ulong)uVar7);
            dd->errorCode = CUDD_INTERNAL_ERROR;
            return (DdNode *)0x0;
          }
          if (hardlimit == 0) {
            psVar5 = (st__table *)0x0;
          }
          else {
            psVar5 = st__init_table(st__ptrcmp,st__ptrhash);
          }
          f = BuildSubsetBdd(dd,(st__table *)fp,f,info,psVar5);
          if (f != (DdNode *)0x0) {
            piVar2 = (int *)(((ulong)f & 0xfffffffffffffffe) + 4);
            *piVar2 = *piVar2 + 1;
          }
          if (psVar5 != (st__table *)0x0) {
            st__free_table(psVar5);
          }
          st__free_table(info->maxpathTable);
          st__foreach((st__table *)fp,stPathTableDdFree,(char *)dd);
          free(info);
        }
        st__free_table((st__table *)fp);
        if (pathLengthArray != (AssortedInfo *)0x0) {
          free(pathLengthArray);
        }
        ppNVar3 = nodeDistPages;
        uVar6 = (ulong)(uint)nodeDistPage;
        if (nodeDistPage < 0) {
          if (nodeDistPages == (NodeDist_t **)0x0) goto LAB_007eb460;
        }
        else {
          lVar11 = 0;
          do {
            if (ppNVar3[lVar11] != (NodeDist_t *)0x0) {
              free(ppNVar3[lVar11]);
              ppNVar3[lVar11] = (NodeDist_t *)0x0;
            }
            lVar11 = lVar11 + 1;
          } while (uVar6 + 1 != lVar11);
        }
        free(ppNVar3);
        nodeDistPages = (NodeDist_t **)0x0;
LAB_007eb460:
        if (f == (DdNode *)0x0) {
          return (DdNode *)0x0;
        }
        piVar2 = (int *)(((ulong)f & 0xfffffffffffffffe) + 4);
        *piVar2 = *piVar2 + -1;
        return f;
      }
      if (fp != (FILE *)0x0) {
        st__free_table((st__table *)fp);
      }
    }
  }
LAB_007eafc7:
  if (pathLengthArray == (AssortedInfo *)0x0) {
    return (DdNode *)0x0;
  }
LAB_007eafcf:
  free(pathLengthArray);
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddSubsetShortPaths(
  DdManager * dd /* DD manager */,
  DdNode * f /* function to be subset */,
  int  numVars /* total number of variables in consideration */,
  int  threshold /* maximum number of nodes allowed in the subset */,
  int  hardlimit /* flag determining whether thershold should be respected strictly */)
{
    st__table *pathTable;
    DdNode *N, *subset;

    unsigned int  *pathLengthArray;
    unsigned int maxpath, oddLen, evenLen, pathLength, *excess;
    int i;
    NodeDist_t  *nodeStat;
    struct AssortedInfo *info;
    st__table *subsetNodeTable;

    one = DD_ONE(dd);
    zero = Cudd_Not(one);

    if (numVars == 0) {
      /* set default value */
      numVars = Cudd_ReadSize(dd);
    }

    if (threshold > numVars) {
        threshold = threshold - numVars;
    }
    if (f == NULL) {
        fprintf(dd->err, "Cannot partition, nil object\n");
        dd->errorCode = CUDD_INVALID_ARG;
        return(NULL);
    }
    if (Cudd_IsConstant(f))
        return (f);

    pathLengthArray = ABC_ALLOC(unsigned int, numVars+1);
    for (i = 0; i < numVars+1; i++) pathLengthArray[i] = 0;


#ifdef DD_DEBUG
    numCalls = 0;
#endif

    pathTable = CreatePathTable(f, pathLengthArray, dd->err);

    if ((pathTable == NULL) || (memOut)) {
        if (pathTable != NULL)
            st__free_table(pathTable);
        ABC_FREE(pathLengthArray);
        return (NIL(DdNode));
    }

    excess = ABC_ALLOC(unsigned int, 1);
    *excess = 0;
    maxpath = AssessPathLength(pathLengthArray, threshold, numVars, excess,
                               dd->err);

    if (maxpath != (unsigned) (numVars + 1)) {

        info = ABC_ALLOC(struct AssortedInfo, 1);
        info->maxpath = maxpath;
        info->findShortestPath = 0;
        info->thresholdReached = *excess;
        info->maxpathTable = st__init_table( st__ptrcmp, st__ptrhash);
        info->threshold = threshold;

#ifdef DD_DEBUG
        (void) fprintf(dd->out, "Path length array\n");
        for (i = 0; i < (numVars+1); i++) {
            if (pathLengthArray[i])
                (void) fprintf(dd->out, "%d ",i);
        }
        (void) fprintf(dd->out, "\n");
        for (i = 0; i < (numVars+1); i++) {
            if (pathLengthArray[i])
                (void) fprintf(dd->out, "%d ",pathLengthArray[i]);
        }
        (void) fprintf(dd->out, "\n");
        (void) fprintf(dd->out, "Maxpath  = %d, Thresholdreached = %d\n",
                       maxpath, info->thresholdReached);
#endif

        N = Cudd_Regular(f);
        if (! st__lookup(pathTable, (const char *)N, (char **)&nodeStat)) {
            fprintf(dd->err, "Something wrong, root node must be in table\n");
            dd->errorCode = CUDD_INTERNAL_ERROR;
            ABC_FREE(excess);
            ABC_FREE(info);
            return(NULL);
        } else {
            if ((nodeStat->oddTopDist != MAXSHORTINT) &&
                (nodeStat->oddBotDist != MAXSHORTINT))
                oddLen = (nodeStat->oddTopDist + nodeStat->oddBotDist);
            else
                oddLen = MAXSHORTINT;

            if ((nodeStat->evenTopDist != MAXSHORTINT) &&
                (nodeStat->evenBotDist != MAXSHORTINT))
                evenLen = (nodeStat->evenTopDist +nodeStat->evenBotDist);
            else
                evenLen = MAXSHORTINT;

            pathLength = (oddLen <= evenLen) ? oddLen : evenLen;
            if (pathLength > maxpath) {
                (void) fprintf(dd->err, "All computations are bogus, since root has path length greater than max path length within threshold %u, %u\n", maxpath, pathLength);
                dd->errorCode = CUDD_INTERNAL_ERROR;
                return(NULL);
            }
        }

#ifdef DD_DEBUG
        numCalls = 0;
        hits = 0;
        thishit = 0;
#endif
        /* initialize a table to store computed nodes */
        if (hardlimit) {
            subsetNodeTable = st__init_table( st__ptrcmp, st__ptrhash);
        } else {
            subsetNodeTable = NIL( st__table);
        }
        subset = BuildSubsetBdd(dd, pathTable, f, info, subsetNodeTable);
        if (subset != NULL) {
            cuddRef(subset);
        }
        /* record the number of times a computed result for a node is hit */

#ifdef DD_DEBUG
        (void) fprintf(dd->out, "Hits = %d, New==Node = %d, NumCalls = %d\n",
                hits, thishit, numCalls);
#endif

        if (subsetNodeTable != NIL( st__table)) {
            st__free_table(subsetNodeTable);
        }
        st__free_table(info->maxpathTable);
        st__foreach(pathTable, stPathTableDdFree, (char *)dd);

        ABC_FREE(info);

    } else {/* if threshold larger than size of dd */
        subset = f;
        cuddRef(subset);
    }
    ABC_FREE(excess);
    st__free_table(pathTable);
    ABC_FREE(pathLengthArray);
    for (i = 0; i <= nodeDistPage; i++) ABC_FREE(nodeDistPages[i]);
    ABC_FREE(nodeDistPages);

#ifdef DD_DEBUG
    /* check containment of subset in f */
    if (subset != NULL) {
        DdNode *check;
        check = Cudd_bddIteConstant(dd, subset, f, one);
        if (check != one) {
            (void) fprintf(dd->err, "Wrong partition\n");
            dd->errorCode = CUDD_INTERNAL_ERROR;
            return(NULL);
        }
    }
#endif

    if (subset != NULL) {
        cuddDeref(subset);
        return(subset);
    } else {
        return(NULL);
    }

}